

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O0

int __thiscall PlatformWindowData::rename(PlatformWindowData *this,char *__old,char *__new)

{
  Display *pDVar1;
  Window WVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  Atom utf8str;
  Atom wmname;
  string title2;
  wstring *name_local;
  PlatformWindowData *this_local;
  
  to_utf8_string((wstring *)&wmname);
  lVar4 = XInternAtom(this->display,"_NET_WM_NAME",1);
  lVar5 = XInternAtom(this->display,"UTF8_STRING",1);
  if (lVar4 == 0) {
    printf("_NET_WM_NAME not found. Window title was not set.\n");
  }
  else {
    if (lVar5 != 0) {
      pDVar1 = this->display;
      WVar2 = this->handle;
      uVar6 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::size();
      XChangeProperty(pDVar1,WVar2,lVar4,lVar5,8,0,uVar6,uVar3);
      std::__cxx11::wstring::operator=((wstring *)&this->title,(wstring *)__old);
      this_local._7_1_ = 1;
      goto LAB_0013a8f2;
    }
    printf("UTF8_STRING not found. Window title was not set.\n");
  }
  this_local._7_1_ = 0;
LAB_0013a8f2:
  uVar6 = std::__cxx11::string::~string((string *)&wmname);
  return (int)CONCAT71((int7)((ulong)uVar6 >> 8),this_local._7_1_);
}

Assistant:

bool rename(std::wstring const& name)
	{
		auto title2 = to_utf8_string(name);
		Atom wmname = XInternAtom(display, "_NET_WM_NAME", True);
		Atom utf8str = XInternAtom(display, "UTF8_STRING", True);
		if(wmname == None){ printf("_NET_WM_NAME not found. Window title was not set.\n"); }
		else
		{
			if(utf8str == None){ printf("UTF8_STRING not found. Window title was not set.\n"); }
			else
			{
				XChangeProperty(display, handle, wmname, utf8str, 8, PropModeReplace, (const unsigned char*)title2.c_str(), title2.size());
				title = name;
				return true;
			}
		}
		return false;
	}